

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O3

uint16_t __thiscall level_tools::get_sector_idx(level_tools *this,fvector3 *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  pointer ppsVar9;
  pointer ppxVar10;
  xr_ogf *pxVar11;
  uint16_t uVar12;
  pointer ppsVar13;
  uint16_t uVar14;
  float fVar15;
  float fVar16;
  
  ppsVar13 = (this->m_sectors->
             super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppsVar9 = (this->m_sectors->
            super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar13 != ppsVar9) {
    ppxVar10 = (this->m_subdivisions->
               super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    fVar1 = (p->field_0).field_0.x;
    fVar2 = (p->field_0).field_0.y;
    fVar3 = (p->field_0).field_0.z;
    fVar15 = 3.4028235e+38;
    uVar12 = 0xffff;
    uVar14 = 0;
    do {
      if ((ulong)((long)(this->m_subdivisions->
                        super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar10 >> 3) <=
          (ulong)(*ppsVar13)->root) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pxVar11 = ppxVar10[(*ppsVar13)->root];
      fVar16 = (pxVar11->m_bbox).field_0.field_1.x1;
      if ((((fVar16 <= fVar1) && (fVar4 = (pxVar11->m_bbox).field_0.field_1.x2, fVar1 <= fVar4)) &&
          (fVar5 = (pxVar11->m_bbox).field_0.field_1.y1, fVar5 <= fVar2)) &&
         (((fVar6 = (pxVar11->m_bbox).field_0.field_1.y2, fVar2 <= fVar6 &&
           (fVar7 = (pxVar11->m_bbox).field_0.field_1.z1, fVar7 <= fVar3)) &&
          ((fVar8 = (pxVar11->m_bbox).field_0.field_1.z2, fVar3 <= fVar8 &&
           (fVar16 = (fVar8 - fVar7) + (fVar6 - fVar5) + (fVar4 - fVar16), fVar16 < fVar15)))))) {
        fVar15 = fVar16;
        uVar12 = uVar14;
      }
      ppsVar13 = ppsVar13 + 1;
      uVar14 = uVar14 + 1;
    } while (ppsVar13 != ppsVar9);
    if (uVar12 != 0xffff) {
      return uVar12;
    }
  }
  __assert_fail("sector_idx != (65535)",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sectors.cxx"
                ,0x59,"uint16_t level_tools::get_sector_idx(const fvector3 &) const");
}

Assistant:

uint16_t level_tools::get_sector_idx(const fvector3& p) const
{
	uint16_t sector_idx = UINT16_MAX;
	float size, min_size = xr_numeric_limits<float>::max();
	for (sector_data_vec_cit it0 = m_sectors->begin(), it = it0, end = m_sectors->end();
			it != end; ++it) {
		const fbox& aabb = m_subdivisions->at((*it)->root)->bbox();
		if (aabb.contain(p) && min_size > (size = aabb.size())) {
			min_size = size;
			sector_idx = uint16_t((it - it0) & UINT16_MAX);
		}
	}
	xr_assert(sector_idx != UINT16_MAX);
	return sector_idx;
}